

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

void wwTrimHi(word *a,size_t n,size_t pos)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = pos >> 6;
  if (uVar2 < n) {
    if ((pos & 0x3f) == 0) {
      a[uVar2] = 0;
    }
    else {
      bVar1 = -(char)(pos & 0x3f);
      a[uVar2] = (a[uVar2] << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
    }
    if (uVar2 + 1 < n) {
      memset(a + uVar2 + 1,0,(~uVar2 + n) * 8);
      return;
    }
  }
  return;
}

Assistant:

void wwTrimHi(word a[], size_t n, size_t pos)
{
	size_t i = pos / B_PER_W;
	ASSERT(wwIsValid(a, n));
	if (i < n)
	{
		pos = B_PER_W - pos % B_PER_W;
		// очистить биты слова a[i]
		if (pos == B_PER_W)
			a[i] = 0;
		else
			a[i] <<= pos, a[i] >>= pos;
		// очистить остальные слова
		while (++i < n)
			a[i] = 0;
	}
}